

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void failure_start(char *filename,wchar_t line,char *fmt,...)

{
  int iVar1;
  bool bVar2;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  failures = failures + L'\x01';
  iVar1 = failed_lines[line].count;
  failed_filename = filename;
  failed_lines[line].count = iVar1 + 1;
  bVar2 = L'\x01' < verbosity;
  if (verbosity == L'\x01') {
    bVar2 = iVar1 < 1;
  }
  log_console = (wchar_t)bVar2;
  local_e8.gp_offset = 0x18;
  local_e8.fp_offset = 0x30;
  local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  logprintf("%s:%d: ",filename);
  vlogprintf(fmt,&local_e8);
  logprintf("\n");
  if ((msg != (char *)0x0) && (*msg != '\0')) {
    logprintf("   Description: %s\n");
    msg = (char *)0x0;
  }
  if (verbosity == L'\x01') {
    log_console = L'\0';
  }
  return;
}

Assistant:

static void
failure_start(const char *filename, int line, const char *fmt, ...)
{
	va_list ap;

	/* Record another failure for this line. */
	++failures;
	failed_filename = filename;
	failed_lines[line].count++;

	/* Determine whether to log header to console. */
	switch (verbosity) {
	case VERBOSITY_LIGHT_REPORT:
		log_console = (failed_lines[line].count < 2);
		break;
	default:
		log_console = (verbosity >= VERBOSITY_FULL);
	}

	/* Log file:line header for this failure */
	va_start(ap, fmt);
#if _MSC_VER
	logprintf("%s(%d): ", filename, line);
#else
	logprintf("%s:%d: ", filename, line);
#endif
	vlogprintf(fmt, ap);
	va_end(ap);
	logprintf("\n");

	if (msg != NULL && msg[0] != '\0') {
		logprintf("   Description: %s\n", msg);
		msg = NULL;
	}

	/* Determine whether to log details to console. */
	if (verbosity == VERBOSITY_LIGHT_REPORT)
		log_console = 0;
}